

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

bool __thiscall tcu::CommandLine::parse(CommandLine *this,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  ValueType *pVVar6;
  ValueType *pVVar7;
  ValueType *pVVar8;
  ValueType *pVVar9;
  FilePath local_358;
  string local_338;
  undefined1 local_318 [8];
  Parser parser;
  ostream local_2f0 [8];
  ostream debugOut;
  undefined1 local_1e0 [8];
  DebugOutStreambuf sbuf;
  char **argv_local;
  int argc_local;
  CommandLine *this_local;
  
  sbuf._432_8_ = argv;
  DebugOutStreambuf::DebugOutStreambuf((DebugOutStreambuf *)local_1e0);
  std::ostream::ostream(local_2f0,(streambuf *)local_1e0);
  de::cmdline::detail::Parser::Parser((Parser *)local_318);
  tcu::opt::registerOptions((Parser *)local_318);
  tcu::opt::registerLegacyOptions((Parser *)local_318);
  (**this->_vptr_CommandLine)(this,local_318);
  clear(this);
  bVar1 = de::cmdline::detail::Parser::parse
                    ((Parser *)local_318,argc + -1,(char **)(sbuf._432_8_ + 8),&this->m_cmdLine,
                     (ostream *)&std::cerr);
  if (bVar1) {
    pVVar6 = de::cmdline::detail::CommandLine::getOption<tcu::opt::LogImages>(&this->m_cmdLine);
    if ((*pVVar6 & 1U) == 0) {
      this->m_logFlags = this->m_logFlags | 1;
    }
    pVVar7 = de::cmdline::detail::CommandLine::getOption<tcu::opt::LogShaderSources>
                       (&this->m_cmdLine);
    if ((*pVVar7 & 1U) == 0) {
      this->m_logFlags = this->m_logFlags | 2;
    }
    pVVar8 = de::cmdline::detail::CommandLine::getOption<tcu::opt::LogFlush>(&this->m_cmdLine);
    if ((*pVVar8 & 1U) == 0) {
      this->m_logFlags = this->m_logFlags | 4;
    }
    bVar1 = de::cmdline::detail::CommandLine::hasOption<tcu::opt::CasePath>(&this->m_cmdLine);
    bVar2 = de::cmdline::detail::CommandLine::hasOption<tcu::opt::CaseList>(&this->m_cmdLine);
    bVar3 = de::cmdline::detail::CommandLine::hasOption<tcu::opt::CaseListFile>(&this->m_cmdLine);
    bVar4 = de::cmdline::detail::CommandLine::hasOption<tcu::opt::CaseListResource>
                      (&this->m_cmdLine);
    pVVar9 = de::cmdline::detail::CommandLine::getOption<tcu::opt::StdinCaseList>(&this->m_cmdLine);
    if ((byte)(bVar1 + bVar2 + bVar3 + bVar4 + ((*pVVar9 & 1U) != 0)) < 2) {
      this_local._7_1_ = true;
    }
    else {
      poVar5 = std::operator<<(local_2f0,"ERROR: multiple test case list options given!\n");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      clear(this);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar5 = std::operator<<(local_2f0,"\n");
    de::FilePath::FilePath(&local_358,*(char **)sbuf._432_8_);
    de::FilePath::getBaseName_abi_cxx11_(&local_338,&local_358);
    poVar5 = std::operator<<(poVar5,(string *)&local_338);
    std::operator<<(poVar5," [options]\n\n");
    std::__cxx11::string::~string((string *)&local_338);
    de::FilePath::~FilePath(&local_358);
    de::cmdline::detail::Parser::help((Parser *)local_318,local_2f0);
    clear(this);
    this_local._7_1_ = false;
  }
  de::cmdline::detail::Parser::~Parser((Parser *)local_318);
  std::ostream::~ostream(local_2f0);
  DebugOutStreambuf::~DebugOutStreambuf((DebugOutStreambuf *)local_1e0);
  return this_local._7_1_;
}

Assistant:

bool CommandLine::parse (int argc, const char* const* argv)
{
	DebugOutStreambuf	sbuf;
	std::ostream		debugOut	(&sbuf);
	de::cmdline::Parser	parser;

	opt::registerOptions(parser);
	opt::registerLegacyOptions(parser);
	registerExtendedOptions(parser);

	clear();

	if (!parser.parse(argc-1, argv+1, &m_cmdLine, std::cerr))
	{
		debugOut << "\n" << de::FilePath(argv[0]).getBaseName() << " [options]\n\n";
		parser.help(debugOut);

		clear();
		return false;
	}

	if (!m_cmdLine.getOption<opt::LogImages>())
		m_logFlags |= QP_TEST_LOG_EXCLUDE_IMAGES;

	if (!m_cmdLine.getOption<opt::LogShaderSources>())
		m_logFlags |= QP_TEST_LOG_EXCLUDE_SHADER_SOURCES;

	if (!m_cmdLine.getOption<opt::LogFlush>())
		m_logFlags |= QP_TEST_LOG_NO_FLUSH;

	if ((m_cmdLine.hasOption<opt::CasePath>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseList>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseListFile>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseListResource>()?1:0) +
		(m_cmdLine.getOption<opt::StdinCaseList>()?1:0) > 1)
	{
		debugOut << "ERROR: multiple test case list options given!\n" << std::endl;
		clear();
		return false;
	}

	return true;
}